

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall
ON_SubDComponentList::UpdateSubDForExperts
          (ON_SubDComponentList *this,ON_SubD *subd,bool bUpdateDeletedComponents)

{
  uint uVar1;
  element_type *peVar2;
  ON_SubDimple *pOVar3;
  ulong in_RAX;
  ulong uVar4;
  ON_COMPONENT_INDEX component_index;
  ON_SubDComponentPtr OVar5;
  ON__UINT64 OVar6;
  ON__UINT64 OVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ON_SubDComponentPtr cptr0;
  ON_SubDComponentPtr local_38;
  
  peVar2 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    OVar6 = 0;
  }
  else {
    OVar6 = peVar2->RuntimeSerialNumber;
  }
  peVar2 = (this->m_subd).m_subdimple_sp.
           super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    OVar7 = 0;
  }
  else {
    OVar7 = peVar2->RuntimeSerialNumber;
  }
  uVar1 = (this->m_component_list).m_count;
  if (OVar6 == OVar7) {
    return uVar1;
  }
  if (uVar1 == 0) {
    iVar9 = 0;
    local_38.m_ptr = in_RAX;
  }
  else {
    uVar8 = 0;
    uVar10 = 0;
    do {
      local_38.m_ptr = (this->m_component_list).m_a[uVar8].m_ptr;
      uVar4 = local_38.m_ptr & 0xfffffffffffffff8;
      uVar11 = uVar10;
      if (((uVar4 != 0 && (local_38.m_ptr & 6) != 0) &&
          (((bUpdateDeletedComponents ||
            ((*(int *)(uVar4 + 8) != 0 && (*(int *)(uVar4 + 0xc) != -1)))) &&
           (component_index = ON_SubDComponentPtr::ComponentIndex(&local_38),
           (ulong)component_index >> 0x20 != 0)))) &&
         (OVar5 = ON_SubD::ComponentPtrFromComponentIndex(subd,component_index),
         7 < OVar5.m_ptr && (OVar5.m_ptr & 6) != 0)) {
        uVar11 = (ulong)((int)uVar10 + 1);
        (this->m_component_list).m_a[uVar10].m_ptr = OVar5.m_ptr;
      }
      iVar9 = (int)uVar11;
      uVar8 = uVar8 + 1;
      uVar10 = uVar11;
    } while (uVar1 != uVar8);
  }
  if ((-1 < iVar9) && (iVar9 <= (this->m_component_list).m_capacity)) {
    (this->m_component_list).m_count = iVar9;
  }
  ON_SubD::ShareDimple(&this->m_subd,subd);
  pOVar3 = (this->m_subd).m_subdimple_sp.
           super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pOVar3 == (ON_SubDimple *)0x0) {
    this->m_subd_runtime_serial_number = 0;
    this->m_subd_geometry_content_serial_number = 0;
  }
  else {
    this->m_subd_runtime_serial_number = pOVar3->RuntimeSerialNumber;
    OVar6 = ON_SubDimple::GeometryContentSerialNumber(pOVar3);
    pOVar3 = (this->m_subd).m_subdimple_sp.
             super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this->m_subd_geometry_content_serial_number = OVar6;
    if (pOVar3 != (ON_SubDimple *)0x0) {
      OVar6 = ON_SubDimple::RenderContentSerialNumber(pOVar3);
      goto LAB_005ef00c;
    }
  }
  OVar6 = 0;
LAB_005ef00c:
  this->m_subd_render_content_serial_number = OVar6;
  return (this->m_component_list).m_count;
}

Assistant:

unsigned int ON_SubDComponentList::UpdateSubDForExperts(const ON_SubD & subd, bool bUpdateDeletedComponents)
{
  const unsigned count0 = Count();
  if (subd.RuntimeSerialNumber() == m_subd.RuntimeSerialNumber())
    return count0; // the components in this list are in subd.

  // Use the component ids to update the list to reference components in subd.
  unsigned count1 = 0;
  for (unsigned i = 0; i < count0; ++i)
  {
    ON_SubDComponentPtr cptr0 = m_component_list[i];
    const ON_SubDComponentBase* c0 = cptr0.ComponentBase();
    if (nullptr == c0)
      continue;
    if (false == bUpdateDeletedComponents && false == c0->IsActive())
      continue;
    ON_COMPONENT_INDEX ci = cptr0.ComponentIndex();
    if (0 == ci.m_index)
      continue;
    ON_SubDComponentPtr cptr1 = subd.ComponentPtrFromComponentIndex(ci);
    if (cptr1.IsNull())
      continue;
    if (0 != cptr0.ComponentDirection())
      cptr1.SetComponentDirection();
    m_component_list[count1++] = cptr1;
  }
  m_component_list.SetCount(count1);
  m_subd.ShareDimple(subd);
  m_subd_runtime_serial_number = m_subd.RuntimeSerialNumber();
  m_subd_geometry_content_serial_number = m_subd.GeometryContentSerialNumber();
  m_subd_render_content_serial_number = m_subd.RenderContentSerialNumber();
  return Count();
}